

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O3

u32 duckdb_fsst_import(duckdb_fsst_decoder_t *decoder,u8 *buf)

{
  byte bVar1;
  undefined8 uVar2;
  u32 uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  byte bVar9;
  u32 uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined8 local_28;
  u8 lenHisto [8];
  
  uVar10 = 0;
  if (*(int *)(buf + 4) == 0x134140a) {
    bVar1 = buf[8];
    uVar4 = bVar1 & 1;
    decoder->zeroTerminated = (uchar)uVar4;
    uVar2 = *(undefined8 *)(buf + 9);
    local_28 = uVar2;
    decoder->len[0] = '\x01';
    decoder->symbol[0] = 0;
    if ((bVar1 & 1) != 0) {
      local_28 = CONCAT71((int7)((ulong)uVar2 >> 8),(char)uVar2 + -1);
    }
    uVar10 = 0x11;
    uVar8 = 1;
    do {
      bVar1 = *(byte *)((long)&local_28 + (ulong)(uVar8 & 7));
      if (bVar1 != 0) {
        bVar9 = (char)(uVar8 & 7) + 1;
        uVar6 = 0;
        do {
          uVar3 = uVar10;
          uVar11 = (ulong)uVar4;
          decoder->len[uVar11] = bVar9;
          decoder->symbol[uVar11] = 0;
          uVar12 = 0;
          do {
            *(u8 *)((long)decoder->symbol + uVar12 + uVar11 * 8) = buf[uVar3 + (int)uVar12];
            uVar12 = uVar12 + 1;
          } while (uVar12 < bVar9);
          uVar6 = uVar6 + 1;
          uVar4 = uVar4 + 1;
          uVar10 = uVar3 + (int)uVar12;
        } while (uVar6 != bVar1);
        uVar10 = uVar3 + (int)uVar12;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != 9);
    if (uVar4 < 0xff) {
      lVar7 = (ulong)uVar4 + 0x21;
      do {
        builtin_memcpy(decoder->len + lVar7 * 8 + -9,"corrupt",8);
        decoder->len[lVar7 + -0x21] = '\b';
        iVar5 = (int)lVar7;
        lVar7 = lVar7 + 1;
      } while (iVar5 != 0x11f);
    }
  }
  return uVar10;
}

Assistant:

u32 duckdb_fsst_import(duckdb_fsst_decoder_t *decoder, u8 *buf) {
	u64 version = 0;
	u32 code, pos = 17;
	u8 lenHisto[8];

	// version field (first 8 bytes) is now there just for future-proofness, unused still (skipped)
	memcpy(&version, buf, 8);
	if ((version>>32) != FSST_VERSION) return 0;
	decoder->zeroTerminated = buf[8]&1;
	memcpy(lenHisto, buf+9, 8);

	// in case of zero-terminated, first symbol is "" (zero always, may be overwritten)
	decoder->len[0] = 1;
	decoder->symbol[0] = 0;

	// we use lenHisto[0] as 1-byte symbol run length (at the end)
	code = decoder->zeroTerminated;
	if (decoder->zeroTerminated) lenHisto[0]--; // if zeroTerminated, then symbol "" aka 1-byte code=0, is not stored at the end

	// now get all symbols from the buffer
	for(u32 l=1; l<=8; l++) { /* l = 1,2,3,4,5,6,7,8 */
		for(u32 i=0; i < lenHisto[(l&7) /* 1,2,3,4,5,6,7,0 */]; i++, code++)  {
			decoder->len[code] = (l&7)+1; /* len = 2,3,4,5,6,7,8,1  */
			decoder->symbol[code] = 0;
			for(u32 j=0; j<decoder->len[code]; j++)
				((u8*) &decoder->symbol[code])[j] = buf[pos++]; // note this enforces 'little endian' symbols
		}
	}
	if (decoder->zeroTerminated) lenHisto[0]++;

	// fill unused symbols with text "corrupt". Gives a chance to detect corrupted code sequences (if there are unused symbols).
	while(code<255) {
		decoder->symbol[code] = FSST_CORRUPT;
		decoder->len[code++] = 8;
	}
	return pos;
}